

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FontFamily.cpp
# Opt level: O1

FontFaceHandleDefault * __thiscall
Rml::FontFamily::GetFaceHandle(FontFamily *this,FontStyle style,FontWeight weight,int size)

{
  FontFace *this_00;
  int iVar1;
  FontStyle FVar2;
  FontWeight FVar3;
  int iVar4;
  pointer pFVar5;
  FontFaceHandleDefault *pFVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  FontFace *this_01;
  FontFace *pFVar10;
  bool bVar11;
  
  pFVar5 = (this->font_faces).
           super__Vector_base<Rml::FontFamily::FontFaceEntry,_std::allocator<Rml::FontFamily::FontFaceEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->font_faces).
      super__Vector_base<Rml::FontFamily::FontFaceEntry,_std::allocator<Rml::FontFamily::FontFaceEntry>_>
      ._M_impl.super__Vector_impl_data._M_finish == pFVar5) {
    this_01 = (FontFace *)0x0;
  }
  else {
    iVar7 = 0x7fffffff;
    lVar9 = 0;
    uVar8 = 0;
    this_01 = (FontFace *)0x0;
    do {
      this_00 = *(FontFace **)
                 ((long)&(pFVar5->face)._M_t.
                         super___uniq_ptr_impl<Rml::FontFace,_std::default_delete<Rml::FontFace>_>.
                         _M_t.
                         super__Tuple_impl<0UL,_Rml::FontFace_*,_std::default_delete<Rml::FontFace>_>
                         .super__Head_base<0UL,_Rml::FontFace_*,_false>._M_head_impl + lVar9);
      FVar2 = FontFace::GetStyle(this_00);
      bVar11 = true;
      if (FVar2 == style) {
        FVar3 = FontFace::GetWeight(this_00);
        iVar4 = Math::Absolute((uint)FVar3 - (uint)weight);
        pFVar10 = this_01;
        iVar1 = iVar7;
        if (iVar4 < iVar7) {
          pFVar10 = this_00;
          iVar1 = iVar4;
        }
        bVar11 = iVar4 != 0;
        this_01 = this_00;
        if (bVar11) {
          this_01 = pFVar10;
          iVar7 = iVar1;
        }
      }
      if (!bVar11) break;
      uVar8 = uVar8 + 1;
      pFVar5 = (this->font_faces).
               super__Vector_base<Rml::FontFamily::FontFaceEntry,_std::allocator<Rml::FontFamily::FontFaceEntry>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar9 = lVar9 + 0x10;
    } while (uVar8 < (ulong)((long)(this->font_faces).
                                   super__Vector_base<Rml::FontFamily::FontFaceEntry,_std::allocator<Rml::FontFamily::FontFaceEntry>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar5 >> 4));
  }
  if (this_01 == (FontFace *)0x0) {
    return (FontFaceHandleDefault *)0x0;
  }
  pFVar6 = FontFace::GetHandle(this_01,size,true);
  return pFVar6;
}

Assistant:

FontFaceHandleDefault* FontFamily::GetFaceHandle(Style::FontStyle style, Style::FontWeight weight, int size)
{
	int best_dist = INT_MAX;
	FontFace* matching_face = nullptr;
	for (size_t i = 0; i < font_faces.size(); i++)
	{
		FontFace* face = font_faces[i].face.get();

		if (face->GetStyle() == style)
		{
			const int dist = Math::Absolute((int)face->GetWeight() - (int)weight);
			if (dist == 0)
			{
				// Direct match for weight, break the loop early.
				matching_face = face;
				break;
			}
			else if (dist < best_dist)
			{
				// Best match so far for weight, store the face and dist.
				matching_face = face;
				best_dist = dist;
			}
		}
	}

	if (!matching_face)
		return nullptr;

	return matching_face->GetHandle(size, true);
}